

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.cpp
# Opt level: O3

UBool __thiscall icu_63::Measure::operator==(Measure *this,UObject *other)

{
  char *__s1;
  MeasureUnit *pMVar1;
  UBool UVar2;
  int iVar3;
  bool bVar4;
  
  if (this == (Measure *)other) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_UObject)._vptr_UObject[-1] + 8);
  if (((__s1 == *(char **)(other->_vptr_UObject[-1] + 8)) ||
      ((*__s1 != '*' && (iVar3 = strcmp(__s1,*(char **)(other->_vptr_UObject[-1] + 8)), iVar3 == 0))
      )) && (UVar2 = Formattable::operator==(&this->number,(Formattable *)(other + 1)),
            UVar2 != '\0')) {
    pMVar1 = this->unit;
    bVar4 = other[0xf]._vptr_UObject == (_func_int **)0x0;
    if (pMVar1 == (MeasureUnit *)0x0 || bVar4) {
      return (pMVar1 == (MeasureUnit *)0x0) == bVar4;
    }
    iVar3 = (*(pMVar1->super_UObject)._vptr_UObject[4])();
    return (char)iVar3 != '\0';
  }
  return '\0';
}

Assistant:

UBool Measure::operator==(const UObject& other) const {
    if (this == &other) {  // Same object, equal
        return TRUE;
    }
    if (typeid(*this) != typeid(other)) { // Different types, not equal
        return FALSE;
    }
    const Measure &m = static_cast<const Measure&>(other);
    return number == m.number &&
        ((unit == NULL) == (m.unit == NULL)) &&
        (unit == NULL || *unit == *m.unit);
}